

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JP2K.h
# Opt level: O1

void __thiscall
ASDCP::JP2K::Accessor::SIZ::ReadComponent(SIZ *this,ui32_t index,ImageComponent_t *IC)

{
  byte_t *pbVar1;
  long lVar2;
  
  pbVar1 = this->m_MarkerData;
  if (index < (ushort)(*(ushort *)(pbVar1 + 0x22) << 8 | *(ushort *)(pbVar1 + 0x22) >> 8)) {
    lVar2 = (ulong)index * 3;
    IC->Ssize = pbVar1[lVar2 + 0x24];
    IC->XRsize = pbVar1[lVar2 + 0x25];
    IC->YRsize = pbVar1[lVar2 + 0x26];
    return;
  }
  __assert_fail("index < Csize()",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/JP2K.cpp"
                ,0x4f,
                "void ASDCP::JP2K::Accessor::SIZ::ReadComponent(const ui32_t, ASDCP::JP2K::ImageComponent_t &) const"
               );
}

Assistant:

inline ui16_t Csize()   const { return KM_i16_BE(*(ui16_t*)(m_MarkerData + 34)); }